

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O2

string * __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>::deep_str_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"(");
  (**(code **)(**(long **)((long)this + 8) + 0x18))(local_1c0);
  std::operator<<(local_190,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  (**(code **)(**(long **)((long)this + 0x10) + 0x18))(local_1c0);
  std::operator<<(local_190,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  (**(code **)(**(long **)((long)this + 0x18) + 0x18))(local_1c0);
  std::operator<<(local_190,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::operator<<(local_190,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string deep_str() const
      {
        std::stringstream ss;
        ss << "(";
        ss << lhs_->deep_str();
        ss << op_->str();
        ss << rhs_->deep_str();
        ss << ")";
        return ss.str();
      }